

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O3

void nng_http_set_method(nng_http *conn,char *method)

{
  nni_http_set_method(conn,method);
  return;
}

Assistant:

void
nng_http_set_method(nng_http *conn, const char *method)
{
#ifdef NNG_SUPP_HTTP
	nni_http_set_method(conn, method);
#else
	NNI_ARG_UNUSED(conn);
	NNI_ARG_UNUSED(method);
#endif
}